

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::ServiceDescriptor::GetLocationPath
          (ServiceDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  int local_20;
  int local_1c;
  
  local_20 = 6;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(output,&local_20);
  local_1c = (int)(((long)this - *(long *)(*(long *)(this + 0x10) + 0x78)) / 0x30);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(output,&local_1c);
  return;
}

Assistant:

void ServiceDescriptor::GetLocationPath(std::vector<int>* output) const {
  output->push_back(FileDescriptorProto::kServiceFieldNumber);
  output->push_back(index());
}